

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# excerpt_tailer.cpp
# Opt level: O2

bool __thiscall cornelich::excerpt_tailer::next_index(excerpt_tailer *this)

{
  int32_t iVar1;
  char *pcVar2;
  undefined8 in_RDX;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  int iVar3;
  char *__s;
  long lVar4;
  
  lVar4 = this->m_index;
  if (lVar4 < 0) {
    to_start(this);
    lVar4 = this->m_index;
    in_RDX = extraout_RDX;
    if (lVar4 < 0) {
      return false;
    }
  }
  __s = (char *)(lVar4 + 1);
  while( true ) {
    pcVar2 = index(this,__s,(int)in_RDX);
    if ((char)pcVar2 != '\0') {
      this->m_index = (int64_t)__s;
      return true;
    }
    lVar4 = (this->m_chronicle->m_settings).m_entries_per_cycle;
    iVar1 = cycle_for_now((this->m_chronicle->m_settings).m_cycle_length);
    iVar3 = (int)((long)__s / lVar4);
    if (iVar1 < iVar3) break;
    __s = (char *)((long)(iVar3 + 1) * (this->m_chronicle->m_settings).m_entries_per_cycle);
    in_RDX = extraout_RDX_00;
  }
  return false;
}

Assistant:

bool excerpt_tailer::next_index()
{
    if(m_index < 0)
    {
        to_start();
        if(m_index < 0)
            return false;
    }

    auto next = m_index + 1;
    while(true)
    {
        auto found = index(next);
        if(found)
        {
            m_index = next;
            return true;
        }

        auto cycle = static_cast<std::int32_t>(next / m_chronicle.m_settings.entries_per_cycle());
        if(cycle > cycle_for_now(m_chronicle.m_settings.cycle_length()))
            return false;
        next = (cycle + 1) * m_chronicle.m_settings.entries_per_cycle();
    }
}